

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void SharpYUVFilterRow_SSE2(int16_t *A,int16_t *B,int len,uint16_t *best_y,uint16_t *out)

{
  short *psVar1;
  short *psVar2;
  uint16_t *puVar3;
  short *psVar4;
  short *psVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint16_t uVar10;
  uint uVar11;
  int iVar12;
  short sVar13;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  undefined1 auVar14 [16];
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  short sVar38;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  
  lVar6 = 0;
  while (lVar6 + 8 <= (long)len) {
    psVar1 = A + lVar6;
    psVar4 = A + lVar6 + 1;
    psVar2 = B + lVar6;
    psVar5 = B + lVar6 + 1;
    sVar38 = *psVar5 + *psVar1;
    sVar42 = psVar5[1] + psVar1[1];
    sVar43 = psVar5[2] + psVar1[2];
    sVar44 = psVar5[3] + psVar1[3];
    sVar45 = psVar5[4] + psVar1[4];
    sVar46 = psVar5[5] + psVar1[5];
    sVar47 = psVar5[6] + psVar1[6];
    sVar48 = psVar5[7] + psVar1[7];
    sVar13 = *psVar2 + *psVar4;
    sVar15 = psVar2[1] + psVar4[1];
    sVar16 = psVar2[2] + psVar4[2];
    sVar17 = psVar2[3] + psVar4[3];
    sVar18 = psVar2[4] + psVar4[4];
    sVar19 = psVar2[5] + psVar4[5];
    sVar20 = psVar2[6] + psVar4[6];
    sVar21 = psVar2[7] + psVar4[7];
    sVar49 = sVar13 + sVar38 + 8;
    sVar50 = sVar15 + sVar42 + 8;
    sVar51 = sVar16 + sVar43 + 8;
    sVar52 = sVar17 + sVar44 + 8;
    sVar53 = sVar18 + sVar45 + 8;
    sVar54 = sVar19 + sVar46 + 8;
    sVar55 = sVar20 + sVar47 + 8;
    sVar56 = sVar21 + sVar48 + 8;
    auVar39._0_2_ = sVar38 * 2 + sVar49;
    auVar39._2_2_ = sVar42 * 2 + sVar50;
    auVar39._4_2_ = sVar43 * 2 + sVar51;
    auVar39._6_2_ = sVar44 * 2 + sVar52;
    auVar39._8_2_ = sVar45 * 2 + sVar53;
    auVar39._10_2_ = sVar46 * 2 + sVar54;
    auVar39._12_2_ = sVar47 * 2 + sVar55;
    auVar39._14_2_ = sVar48 * 2 + sVar56;
    auVar39 = psraw(auVar39,3);
    auVar14._0_2_ = sVar13 * 2 + sVar49;
    auVar14._2_2_ = sVar15 * 2 + sVar50;
    auVar14._4_2_ = sVar16 * 2 + sVar51;
    auVar14._6_2_ = sVar17 * 2 + sVar52;
    auVar14._8_2_ = sVar18 * 2 + sVar53;
    auVar14._10_2_ = sVar19 * 2 + sVar54;
    auVar14._12_2_ = sVar20 * 2 + sVar55;
    auVar14._14_2_ = sVar21 * 2 + sVar56;
    auVar14 = psraw(auVar14,3);
    auVar41._0_2_ = auVar14._0_2_ + *psVar1;
    auVar41._2_2_ = auVar14._2_2_ + psVar1[1];
    auVar41._4_2_ = auVar14._4_2_ + psVar1[2];
    auVar41._6_2_ = auVar14._6_2_ + psVar1[3];
    auVar41._8_2_ = auVar14._8_2_ + psVar1[4];
    auVar41._10_2_ = auVar14._10_2_ + psVar1[5];
    auVar41._12_2_ = auVar14._12_2_ + psVar1[6];
    auVar41._14_2_ = auVar14._14_2_ + psVar1[7];
    auVar40._0_2_ = auVar39._0_2_ + *psVar4;
    auVar40._2_2_ = auVar39._2_2_ + psVar4[1];
    auVar40._4_2_ = auVar39._4_2_ + psVar4[2];
    auVar40._6_2_ = auVar39._6_2_ + psVar4[3];
    auVar40._8_2_ = auVar39._8_2_ + psVar4[4];
    auVar40._10_2_ = auVar39._10_2_ + psVar4[5];
    auVar40._12_2_ = auVar39._12_2_ + psVar4[6];
    auVar40._14_2_ = auVar39._14_2_ + psVar4[7];
    auVar14 = psraw(auVar41,1);
    auVar41 = psraw(auVar40,1);
    puVar3 = best_y + lVar6 * 2;
    sVar38 = *puVar3 + auVar14._0_2_;
    sVar42 = puVar3[1] + auVar41._0_2_;
    sVar43 = puVar3[2] + auVar14._2_2_;
    sVar44 = puVar3[3] + auVar41._2_2_;
    sVar45 = puVar3[4] + auVar14._4_2_;
    sVar46 = puVar3[5] + auVar41._4_2_;
    sVar47 = puVar3[6] + auVar14._6_2_;
    sVar48 = puVar3[7] + auVar41._6_2_;
    puVar3 = best_y + lVar6 * 2 + 8;
    sVar13 = *puVar3 + auVar14._8_2_;
    sVar15 = puVar3[1] + auVar41._8_2_;
    sVar16 = puVar3[2] + auVar14._10_2_;
    sVar17 = puVar3[3] + auVar41._10_2_;
    sVar18 = puVar3[4] + auVar14._12_2_;
    sVar19 = puVar3[5] + auVar41._12_2_;
    sVar20 = puVar3[6] + auVar14._14_2_;
    sVar21 = puVar3[7] + auVar41._14_2_;
    uVar30 = (ushort)(0x3ff < sVar38) * 0x3ff | (ushort)(0x3ff >= sVar38) * sVar38;
    uVar31 = (ushort)(0x3ff < sVar42) * 0x3ff | (ushort)(0x3ff >= sVar42) * sVar42;
    uVar32 = (ushort)(0x3ff < sVar43) * 0x3ff | (ushort)(0x3ff >= sVar43) * sVar43;
    uVar33 = (ushort)(0x3ff < sVar44) * 0x3ff | (ushort)(0x3ff >= sVar44) * sVar44;
    uVar34 = (ushort)(0x3ff < sVar45) * 0x3ff | (ushort)(0x3ff >= sVar45) * sVar45;
    uVar35 = (ushort)(0x3ff < sVar46) * 0x3ff | (ushort)(0x3ff >= sVar46) * sVar46;
    uVar36 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    uVar37 = (ushort)(0x3ff < sVar48) * 0x3ff | (ushort)(0x3ff >= sVar48) * sVar48;
    uVar22 = (ushort)(0x3ff < sVar13) * 0x3ff | (ushort)(0x3ff >= sVar13) * sVar13;
    uVar23 = (ushort)(0x3ff < sVar15) * 0x3ff | (ushort)(0x3ff >= sVar15) * sVar15;
    uVar24 = (ushort)(0x3ff < sVar16) * 0x3ff | (ushort)(0x3ff >= sVar16) * sVar16;
    uVar25 = (ushort)(0x3ff < sVar17) * 0x3ff | (ushort)(0x3ff >= sVar17) * sVar17;
    uVar26 = (ushort)(0x3ff < sVar18) * 0x3ff | (ushort)(0x3ff >= sVar18) * sVar18;
    uVar27 = (ushort)(0x3ff < sVar19) * 0x3ff | (ushort)(0x3ff >= sVar19) * sVar19;
    uVar28 = (ushort)(0x3ff < sVar20) * 0x3ff | (ushort)(0x3ff >= sVar20) * sVar20;
    uVar29 = (ushort)(0x3ff < sVar21) * 0x3ff | (ushort)(0x3ff >= sVar21) * sVar21;
    puVar3 = out + lVar6 * 2;
    *puVar3 = (-1 < (short)uVar30) * uVar30;
    puVar3[1] = (-1 < (short)uVar31) * uVar31;
    puVar3[2] = (-1 < (short)uVar32) * uVar32;
    puVar3[3] = (-1 < (short)uVar33) * uVar33;
    puVar3[4] = (-1 < (short)uVar34) * uVar34;
    puVar3[5] = (-1 < (short)uVar35) * uVar35;
    puVar3[6] = (-1 < (short)uVar36) * uVar36;
    puVar3[7] = (-1 < (short)uVar37) * uVar37;
    puVar3 = out + lVar6 * 2 + 8;
    *puVar3 = (-1 < (short)uVar22) * uVar22;
    puVar3[1] = (-1 < (short)uVar23) * uVar23;
    puVar3[2] = (-1 < (short)uVar24) * uVar24;
    puVar3[3] = (-1 < (short)uVar25) * uVar25;
    puVar3[4] = (-1 < (short)uVar26) * uVar26;
    puVar3[5] = (-1 < (short)uVar27) * uVar27;
    puVar3[6] = (-1 < (short)uVar28) * uVar28;
    puVar3[7] = (-1 < (short)uVar29) * uVar29;
    lVar6 = lVar6 + 8;
  }
  for (; lVar6 < len; lVar6 = lVar6 + 1) {
    iVar7 = (int)B[lVar6 + 1] + (int)A[lVar6];
    sVar13 = A[lVar6 + 1];
    iVar12 = (int)B[lVar6] + (int)sVar13;
    iVar8 = iVar7 + iVar12 + 8;
    uVar9 = (uint)best_y[lVar6 * 2] + (A[lVar6] * 8 + iVar12 * 2 + iVar8 >> 4);
    uVar11 = 0x3ff;
    if (uVar9 < 0x3ff) {
      uVar11 = uVar9;
    }
    uVar10 = (uint16_t)uVar11;
    if ((int)uVar9 < 0) {
      uVar10 = 0;
    }
    out[lVar6 * 2] = uVar10;
    uVar9 = (uint)best_y[lVar6 * 2 + 1] + (iVar7 * 2 + sVar13 * 8 + iVar8 >> 4);
    uVar11 = 0x3ff;
    if (uVar9 < 0x3ff) {
      uVar11 = uVar9;
    }
    uVar10 = (uint16_t)uVar11;
    if ((int)uVar9 < 0) {
      uVar10 = 0;
    }
    out[lVar6 * 2 + 1] = uVar10;
  }
  return;
}

Assistant:

static void SharpYUVFilterRow_SSE2(const int16_t* A, const int16_t* B, int len,
                                   const uint16_t* best_y, uint16_t* out) {
  int i;
  const __m128i kCst8 = _mm_set1_epi16(8);
  const __m128i max = _mm_set1_epi16(MAX_Y);
  const __m128i zero = _mm_setzero_si128();
  for (i = 0; i + 8 <= len; i += 8) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)(A + i + 0));
    const __m128i a1 = _mm_loadu_si128((const __m128i*)(A + i + 1));
    const __m128i b0 = _mm_loadu_si128((const __m128i*)(B + i + 0));
    const __m128i b1 = _mm_loadu_si128((const __m128i*)(B + i + 1));
    const __m128i a0b1 = _mm_add_epi16(a0, b1);
    const __m128i a1b0 = _mm_add_epi16(a1, b0);
    const __m128i a0a1b0b1 = _mm_add_epi16(a0b1, a1b0);  // A0+A1+B0+B1
    const __m128i a0a1b0b1_8 = _mm_add_epi16(a0a1b0b1, kCst8);
    const __m128i a0b1_2 = _mm_add_epi16(a0b1, a0b1);    // 2*(A0+B1)
    const __m128i a1b0_2 = _mm_add_epi16(a1b0, a1b0);    // 2*(A1+B0)
    const __m128i c0 = _mm_srai_epi16(_mm_add_epi16(a0b1_2, a0a1b0b1_8), 3);
    const __m128i c1 = _mm_srai_epi16(_mm_add_epi16(a1b0_2, a0a1b0b1_8), 3);
    const __m128i d0 = _mm_add_epi16(c1, a0);
    const __m128i d1 = _mm_add_epi16(c0, a1);
    const __m128i e0 = _mm_srai_epi16(d0, 1);
    const __m128i e1 = _mm_srai_epi16(d1, 1);
    const __m128i f0 = _mm_unpacklo_epi16(e0, e1);
    const __m128i f1 = _mm_unpackhi_epi16(e0, e1);
    const __m128i g0 = _mm_loadu_si128((const __m128i*)(best_y + 2 * i + 0));
    const __m128i g1 = _mm_loadu_si128((const __m128i*)(best_y + 2 * i + 8));
    const __m128i h0 = _mm_add_epi16(g0, f0);
    const __m128i h1 = _mm_add_epi16(g1, f1);
    const __m128i i0 = _mm_max_epi16(_mm_min_epi16(h0, max), zero);
    const __m128i i1 = _mm_max_epi16(_mm_min_epi16(h1, max), zero);
    _mm_storeu_si128((__m128i*)(out + 2 * i + 0), i0);
    _mm_storeu_si128((__m128i*)(out + 2 * i + 8), i1);
  }
  for (; i < len; ++i) {
    //   (9 * A0 + 3 * A1 + 3 * B0 + B1 + 8) >> 4 =
    // = (8 * A0 + 2 * (A1 + B0) + (A0 + A1 + B0 + B1 + 8)) >> 4
    // We reuse the common sub-expressions.
    const int a0b1 = A[i + 0] + B[i + 1];
    const int a1b0 = A[i + 1] + B[i + 0];
    const int a0a1b0b1 = a0b1 + a1b0 + 8;
    const int v0 = (8 * A[i + 0] + 2 * a1b0 + a0a1b0b1) >> 4;
    const int v1 = (8 * A[i + 1] + 2 * a0b1 + a0a1b0b1) >> 4;
    out[2 * i + 0] = clip_y(best_y[2 * i + 0] + v0);
    out[2 * i + 1] = clip_y(best_y[2 * i + 1] + v1);
  }
}